

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptParameterDeclaration(HlslGrammar *this,TFunction *function)

{
  TArraySizes *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TPoolAllocator *this_01;
  TType *this_02;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  HlslToken *loc;
  HlslParseContext *pHVar6;
  _func_int **pp_Var7;
  TIntermTyped *defaultValue;
  TArraySizes *arraySizes;
  HlslToken idToken;
  TAttributes attributes;
  TParameter param;
  TIntermTyped *local_a8;
  TArraySizes *local_a0;
  HlslToken local_98;
  TAttributes local_68;
  anon_union_8_5_54ae9b2d_for_HlslToken_2 local_48;
  TType *local_40;
  TIntermTyped *local_38;
  
  local_68.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
  local_68.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_next =
       &local_68.
        super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
        super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
        ._M_impl._M_node.super__List_node_base;
  local_68.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = 0;
  local_68.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node.super__List_node_base._M_prev =
       local_68.
       super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  acceptAttributes(this,&local_68);
  this_01 = GetThreadPoolAllocator();
  this_02 = (TType *)TPoolAllocator::allocate(this_01,0x98);
  TType::TType(this_02,EbtVoid,EvqTemporary,1,0,0,false);
  local_98.loc.name = (TString *)0x0;
  bVar1 = acceptFullySpecifiedType(this,this_02,(TIntermNode **)&local_98,&local_68,false);
  if (!bVar1) {
    return false;
  }
  loc = &(this->super_HlslTokenStream).token;
  HlslParseContext::transferTypeAttributes(this->parseContext,&loc->loc,&local_68,this_02,false);
  local_98.field_2.string = (TString *)0x0;
  local_98.loc.name = (TString *)0x0;
  local_98.loc.string = 0;
  local_98.loc.line = 0;
  local_98.loc.column = 0;
  acceptIdentifier(this,&local_98);
  local_a0 = (TArraySizes *)0x0;
  acceptArraySpecifier(this,&local_a0);
  this_00 = local_a0;
  if (local_a0 != (TArraySizes *)0x0) {
    uVar2 = TSmallArrayVector::frontSize(&local_a0->sizes);
    if ((uVar2 == 0) || (bVar1 = TArraySizes::isInnerUnsized(this_00), bVar1)) {
      pHVar6 = this->parseContext;
      pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar5 = "function parameter requires array size";
      pcVar4 = "[]";
      goto LAB_003a791d;
    }
    this_02->arraySizes = this_00;
  }
  iVar3 = (*this_02->_vptr_TType[10])(this_02);
  acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar3));
  bVar1 = acceptDefaultParameterDeclaration(this,this_02,&local_a8);
  if (!bVar1) {
    return false;
  }
  HlslParseContext::paramFix(this->parseContext,this_02);
  if ((local_a8 != (TIntermTyped *)0x0) ||
     (iVar3 = (*(function->super_TSymbol)._vptr_TSymbol[0x25])(function), iVar3 < 1)) {
    local_48.string = local_98.field_2.string;
    local_38 = local_a8;
    local_40 = this_02;
    (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function);
    return true;
  }
  pHVar6 = this->parseContext;
  loc = &local_98;
  pcVar4 = ((local_98.field_2.string)->_M_dataplus)._M_p;
  pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
  pcVar5 = "invalid parameter after default value parameters";
LAB_003a791d:
  (*pp_Var7[0x2d])(pHVar6,loc,pcVar5,pcVar4,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptParameterDeclaration(TFunction& function)
{
    // attributes
    TAttributes attributes;
    acceptAttributes(attributes);

    // fully_specified_type
    TType* type = new TType;
    if (! acceptFullySpecifiedType(*type, attributes))
        return false;

    // merge in the attributes
    parseContext.transferTypeAttributes(token.loc, attributes, *type);

    // identifier
    HlslToken idToken;
    acceptIdentifier(idToken);

    // array_specifier
    TArraySizes* arraySizes = nullptr;
    acceptArraySpecifier(arraySizes);
    if (arraySizes) {
        if (arraySizes->hasUnsized()) {
            parseContext.error(token.loc, "function parameter requires array size", "[]", "");
            return false;
        }

        type->transferArraySizes(arraySizes);
    }

    // post_decls
    acceptPostDecls(type->getQualifier());

    TIntermTyped* defaultValue;
    if (!acceptDefaultParameterDeclaration(*type, defaultValue))
        return false;

    parseContext.paramFix(*type);

    // If any prior parameters have default values, all the parameters after that must as well.
    if (defaultValue == nullptr && function.getDefaultParamCount() > 0) {
        parseContext.error(idToken.loc, "invalid parameter after default value parameters", idToken.string->c_str(), "");
        return false;
    }

    TParameter param = { idToken.string, type, defaultValue };
    function.addParameter(param);

    return true;
}